

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalSlot.h
# Opt level: O3

void __thiscall
Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>::operator()
          (Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>
           *this,shared_ptr<SocketClient> *args,Error *args_1)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Base_ptr p_Var3;
  map<unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_SocketClient::Error)>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_SocketClient::Error)>_>_>_>
  conn;
  Error local_5c;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_SocketClient::Error)>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_SocketClient::Error)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_SocketClient::Error)>_>_>_>
  local_58;
  
  p_Var1 = &local_58._M_impl.super__Rb_tree_header;
  local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_58._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)(this + 8));
  if (iVar2 != 0) {
LAB_001636a9:
    std::__throw_system_error(iVar2);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_SocketClient::Error)>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_SocketClient::Error)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_SocketClient::Error)>_>_>_>
  ::operator=(&local_58,
              (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_SocketClient::Error)>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_SocketClient::Error)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_SocketClient::Error)>_>_>_>
               *)(this + 0x30));
  pthread_mutex_unlock((pthread_mutex_t *)(this + 8));
  if ((_Rb_tree_header *)local_58._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    p_Var3 = local_58._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_5c = *args_1;
      if (p_Var3[1]._M_right == (_Base_ptr)0x0) {
        iVar2 = std::__throw_bad_function_call();
        goto LAB_001636a9;
      }
      (**(code **)(p_Var3 + 2))(&p_Var3[1]._M_parent,args,&local_5c);
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_SocketClient::Error)>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_SocketClient::Error)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_SocketClient::Error)>_>_>_>
  ::~_Rb_tree(&local_58);
  return;
}

Assistant:

void operator()(Args&&... args)
    {
        std::map<Key, Signature> conn;
        {
            std::lock_guard<std::mutex> locker(mutex);
            conn = connections;
        }
        for (auto& connection : conn) {
            connection.second(std::forward<Args>(args)...);
        }
    }